

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool do_constant_folding_cond_32(uint32_t x,uint32_t y,TCGCond c)

{
  TCGCond c_local;
  uint32_t y_local;
  uint32_t x_local;
  
  switch(c) {
  case TCG_COND_LT:
    y_local._3_1_ = (int)x < (int)y;
    break;
  case TCG_COND_GE:
    y_local._3_1_ = (int)y <= (int)x;
    break;
  case TCG_COND_LTU:
    y_local._3_1_ = x < y;
    break;
  case TCG_COND_GEU:
    y_local._3_1_ = y <= x;
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
            ,0x1c3);
    abort();
  case TCG_COND_EQ:
    y_local._3_1_ = x == y;
    break;
  case TCG_COND_NE:
    y_local._3_1_ = x != y;
    break;
  case TCG_COND_LE:
    y_local._3_1_ = (int)x <= (int)y;
    break;
  case TCG_COND_GT:
    y_local._3_1_ = (int)y < (int)x;
    break;
  case TCG_COND_LEU:
    y_local._3_1_ = x <= y;
    break;
  case TCG_COND_GTU:
    y_local._3_1_ = y < x;
  }
  return y_local._3_1_;
}

Assistant:

static bool do_constant_folding_cond_32(uint32_t x, uint32_t y, TCGCond c)
{
    switch (c) {
    case TCG_COND_EQ:
        return x == y;
    case TCG_COND_NE:
        return x != y;
    case TCG_COND_LT:
        return (int32_t)x < (int32_t)y;
    case TCG_COND_GE:
        return (int32_t)x >= (int32_t)y;
    case TCG_COND_LE:
        return (int32_t)x <= (int32_t)y;
    case TCG_COND_GT:
        return (int32_t)x > (int32_t)y;
    case TCG_COND_LTU:
        return x < y;
    case TCG_COND_GEU:
        return x >= y;
    case TCG_COND_LEU:
        return x <= y;
    case TCG_COND_GTU:
        return x > y;
    default:
        tcg_abort();
    }
}